

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlValidatePushElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlChar *qname)

{
  xmlElementPtr pxVar1;
  _xmlElementContent *p_Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  xmlNodePtr pxVar6;
  xmlValidState *pxVar7;
  xmlRegExecCtxtPtr pxVar8;
  xmlParserErrors code;
  uint uVar9;
  uint uVar10;
  xmlChar *pxVar11;
  _xmlElementContent *p_Var12;
  char *msg;
  int local_40;
  int extsubset;
  xmlChar *local_38;
  
  extsubset = 0;
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    return 0;
  }
  iVar5 = 1;
  if ((0 < ctxt->vstateNr) && (pxVar7 = ctxt->vstate, pxVar7 != (xmlValidState *)0x0)) {
    pxVar1 = pxVar7->elemDecl;
    iVar5 = 1;
    bVar3 = true;
    if (pxVar1 == (xmlElementPtr)0x0) {
switchD_00158f1a_caseD_2:
      iVar5 = 1;
    }
    else {
      switch(pxVar1->etype) {
      case XML_ELEMENT_TYPE_UNDEFINED:
        iVar5 = 0;
        break;
      case XML_ELEMENT_TYPE_EMPTY:
        pxVar11 = pxVar7->node->name;
        iVar5 = 0;
        xmlDoErrValid(ctxt,pxVar7->node,XML_DTD_NOT_EMPTY,2,pxVar11,(xmlChar *)0x0,(xmlChar *)0x0,0,
                      "Element %s was declared EMPTY this one has content\n",pxVar11,0,0);
        bVar3 = true;
        break;
      default:
        goto switchD_00158f1a_caseD_2;
      case XML_ELEMENT_TYPE_MIXED:
        p_Var12 = pxVar1->content;
        if ((p_Var12 == (xmlElementContentPtr)0x0) || (p_Var12->type != XML_ELEMENT_CONTENT_PCDATA))
        {
          local_38 = xmlSplitQName3(qname,&local_40);
          if (local_38 == (xmlChar *)0x0) {
            for (; p_Var12 != (xmlElementContentPtr)0x0; p_Var12 = p_Var12->c2) {
              if (p_Var12->type == XML_ELEMENT_CONTENT_OR) {
                p_Var2 = p_Var12->c1;
                if ((p_Var2 == (_xmlElementContent *)0x0) ||
                   (p_Var2->type != XML_ELEMENT_CONTENT_ELEMENT)) {
                  if ((p_Var2 == (_xmlElementContent *)0x0) ||
                     (p_Var2->type != XML_ELEMENT_CONTENT_PCDATA)) break;
                }
                else if (p_Var2->prefix == (xmlChar *)0x0) {
                  pxVar11 = p_Var2->name;
                  goto LAB_00159181;
                }
              }
              else {
                if (p_Var12->type != XML_ELEMENT_CONTENT_ELEMENT) break;
                if (p_Var12->prefix == (xmlChar *)0x0) {
                  pxVar11 = p_Var12->name;
LAB_00159181:
                  iVar5 = xmlStrEqual(pxVar11,qname);
                  if (iVar5 != 0) goto LAB_00159397;
                }
              }
            }
          }
          else {
            bVar3 = true;
            for (; p_Var12 != (xmlElementContentPtr)0x0; p_Var12 = p_Var12->c2) {
              if (p_Var12->type == XML_ELEMENT_CONTENT_OR) {
                p_Var2 = p_Var12->c1;
                if ((p_Var2 == (_xmlElementContent *)0x0) ||
                   (p_Var2->type != XML_ELEMENT_CONTENT_ELEMENT)) {
                  if ((p_Var2 == (_xmlElementContent *)0x0) ||
                     (p_Var2->type != XML_ELEMENT_CONTENT_PCDATA)) goto LAB_001591ac;
                }
                else if ((p_Var2->prefix != (xmlChar *)0x0) &&
                        (iVar5 = xmlStrncmp(p_Var2->prefix,qname,local_40), iVar5 == 0)) {
                  pxVar11 = p_Var12->c1->name;
                  goto LAB_001590bf;
                }
              }
              else {
                if (p_Var12->type != XML_ELEMENT_CONTENT_ELEMENT) {
LAB_001591ac:
                  iVar5 = 0;
                  xmlDoErrValid(ctxt,(xmlNodePtr)0x0,XML_DTD_MIXED_CORRUPT,2,(xmlChar *)0x0,
                                (xmlChar *)0x0,(xmlChar *)0x0,0,"Internal: MIXED struct corrupted\n"
                                ,0);
                  goto LAB_001591de;
                }
                if ((p_Var12->prefix != (xmlChar *)0x0) &&
                   (iVar5 = xmlStrncmp(p_Var12->prefix,qname,local_40), iVar5 == 0)) {
                  pxVar11 = p_Var12->name;
LAB_001590bf:
                  iVar5 = xmlStrEqual(pxVar11,local_38);
                  if (iVar5 != 0) goto LAB_00159397;
                }
              }
            }
          }
          bVar3 = true;
          iVar5 = 0;
          goto LAB_001591de;
        }
        pxVar6 = pxVar7->node;
        qname = pxVar6->name;
        pxVar11 = (xmlChar *)0x0;
        msg = "Element %s was declared #PCDATA but contains non text nodes\n";
        iVar5 = 0;
        code = XML_DTD_NOT_PCDATA;
        goto LAB_00159215;
      case XML_ELEMENT_TYPE_ELEMENT:
        if (pxVar7->exec != (xmlRegExecCtxtPtr)0x0) {
          iVar4 = xmlRegExecPushString(pxVar7->exec,qname,(void *)0x0);
          if (iVar4 == -5) {
            xmlVErrMemory(ctxt);
            iVar5 = -5;
            bVar3 = false;
          }
          else {
            bVar3 = true;
            if (iVar4 < 0) {
              pxVar11 = pxVar7->node->name;
              iVar5 = 0;
              xmlDoErrValid(ctxt,pxVar7->node,XML_DTD_CONTENT_MODEL,2,pxVar11,qname,(xmlChar *)0x0,0
                            ,"Element %s content does not follow the DTD, Misplaced %s\n",pxVar11,
                            qname,0);
              bVar3 = true;
            }
          }
        }
      }
    }
LAB_0015922e:
    if (!bVar3) {
      return 0;
    }
  }
  pxVar6 = (xmlNodePtr)xmlValidGetElemDecl(ctxt,doc,elem,&extsubset);
  iVar4 = ctxt->vstateMax;
  if (ctxt->vstateNr < iVar4) {
LAB_001592af:
    pxVar7 = ctxt->vstateTab + ctxt->vstateNr;
    ctxt->vstate = pxVar7;
    pxVar7->elemDecl = (xmlElementPtr)pxVar6;
    pxVar7->node = elem;
    if ((pxVar6 != (xmlNodePtr)0x0) && (*(int *)&pxVar6->ns == 4)) {
      if (pxVar6->psvi == (void *)0x0) {
        xmlValidBuildContentModel(ctxt,(xmlElementPtr)pxVar6);
      }
      if ((xmlRegexpPtr)pxVar6->psvi == (xmlRegexpPtr)0x0) {
        ctxt->vstateTab[ctxt->vstateNr].exec = (xmlRegExecCtxtPtr)0x0;
        xmlDoErrValid(ctxt,pxVar6,XML_ERR_INTERNAL_ERROR,2,elem->name,(xmlChar *)0x0,(xmlChar *)0x0,
                      0,"Failed to build content model regexp for %s\n",elem->name,0,0);
      }
      else {
        pxVar8 = xmlRegNewExecCtxt((xmlRegexpPtr)pxVar6->psvi,(xmlRegExecCallbacks)0x0,(void *)0x0);
        ctxt->vstateTab[ctxt->vstateNr].exec = pxVar8;
        if (pxVar8 == (xmlRegExecCtxtPtr)0x0) goto LAB_00159318;
      }
    }
    ctxt->vstateNr = ctxt->vstateNr + 1;
  }
  else {
    if (iVar4 < 1) {
      uVar10 = 10;
    }
    else {
      uVar10 = 0xffffffff;
      if (iVar4 < 1000000000) {
        uVar9 = iVar4 + 1U >> 1;
        uVar10 = uVar9 + iVar4;
        if ((int)(1000000000 - uVar9) < iVar4) {
          uVar10 = 1000000000;
        }
      }
    }
    if ((-1 < (int)uVar10) &&
       (pxVar7 = (xmlValidState *)(*xmlRealloc)(ctxt->vstateTab,(ulong)uVar10 * 0x18),
       pxVar7 != (xmlValidState *)0x0)) {
      ctxt->vstateTab = pxVar7;
      ctxt->vstateMax = uVar10;
      goto LAB_001592af;
    }
LAB_00159318:
    xmlVErrMemory(ctxt);
  }
  return iVar5;
LAB_00159397:
  iVar5 = 1;
  bVar3 = false;
LAB_001591de:
  if (bVar3) {
    pxVar6 = pxVar7->node;
    pxVar11 = pxVar6->name;
    code = XML_DTD_INVALID_CHILD;
    msg = "Element %s is not declared in %s list of possible children\n";
LAB_00159215:
    xmlDoErrValid(ctxt,pxVar6,code,2,qname,pxVar11,(xmlChar *)0x0,0,msg,qname,pxVar11,0);
  }
  else {
    iVar5 = 1;
  }
  bVar3 = true;
  goto LAB_0015922e;
}

Assistant:

int
xmlValidatePushElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                       xmlNodePtr elem, const xmlChar *qname) {
    int ret = 1;
    xmlElementPtr eDecl;
    int extsubset = 0;

    if (ctxt == NULL)
        return(0);

    if ((ctxt->vstateNr > 0) && (ctxt->vstate != NULL)) {
	xmlValidStatePtr state = ctxt->vstate;
	xmlElementPtr elemDecl;

	/*
	 * Check the new element against the content model of the new elem.
	 */
	if (state->elemDecl != NULL) {
	    elemDecl = state->elemDecl;

	    switch(elemDecl->etype) {
		case XML_ELEMENT_TYPE_UNDEFINED:
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_EMPTY:
		    xmlErrValidNode(ctxt, state->node,
				    XML_DTD_NOT_EMPTY,
	       "Element %s was declared EMPTY this one has content\n",
			   state->node->name, NULL, NULL);
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_ANY:
		    /* I don't think anything is required then */
		    break;
		case XML_ELEMENT_TYPE_MIXED:
		    /* simple case of declared as #PCDATA */
		    if ((elemDecl->content != NULL) &&
			(elemDecl->content->type ==
			 XML_ELEMENT_CONTENT_PCDATA)) {
			xmlErrValidNode(ctxt, state->node,
					XML_DTD_NOT_PCDATA,
	       "Element %s was declared #PCDATA but contains non text nodes\n",
				state->node->name, NULL, NULL);
			ret = 0;
		    } else {
			ret = xmlValidateCheckMixed(ctxt, elemDecl->content,
				                    qname);
			if (ret != 1) {
			    xmlErrValidNode(ctxt, state->node,
					    XML_DTD_INVALID_CHILD,
	       "Element %s is not declared in %s list of possible children\n",
				    qname, state->node->name, NULL);
			}
		    }
		    break;
		case XML_ELEMENT_TYPE_ELEMENT:
		    /*
		     * TODO:
		     * VC: Standalone Document Declaration
		     *     - element types with element content, if white space
		     *       occurs directly within any instance of those types.
		     */
		    if (state->exec != NULL) {
			ret = xmlRegExecPushString(state->exec, qname, NULL);
                        if (ret == XML_REGEXP_OUT_OF_MEMORY) {
                            xmlVErrMemory(ctxt);
                            return(0);
                        }
			if (ret < 0) {
			    xmlErrValidNode(ctxt, state->node,
					    XML_DTD_CONTENT_MODEL,
	       "Element %s content does not follow the DTD, Misplaced %s\n",
				   state->node->name, qname, NULL);
			    ret = 0;
			} else {
			    ret = 1;
			}
		    }
		    break;
	    }
	}
    }
    eDecl = xmlValidGetElemDecl(ctxt, doc, elem, &extsubset);
    vstateVPush(ctxt, eDecl, elem);
    return(ret);
}